

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

void __thiscall CVmObjTable::gc_trace_globals(CVmObjTable *this)

{
  size_t sVar1;
  CVmObjPageEntry *pCVar2;
  undefined4 uVar3;
  CVmObjGlobPage *pCVar4;
  vm_globalvar_t *pvVar5;
  uint uVar6;
  size_t sVar7;
  ushort uVar8;
  uint uVar9;
  
  for (pCVar4 = this->globals_; uVar3 = r0_.val.obj, pCVar4 != (CVmObjGlobPage *)0x0;
      pCVar4 = pCVar4->nxt_) {
    sVar1 = pCVar4->used_;
    if (sVar1 != 0) {
      sVar7 = 0;
      do {
        uVar6 = pCVar4->objs_[sVar7];
        pCVar2 = this->pages_[uVar6 >> 0xc];
        uVar9 = uVar6 & 0xfff;
        uVar8 = *(ushort *)&pCVar2[uVar9].field_0x14;
        if ((uVar8 & 0x20c) == 0x200) {
          pCVar2[uVar9].next_obj_ = this->gc_queue_head_;
          this->gc_queue_head_ = uVar6;
          uVar8 = *(ushort *)&pCVar2[uVar9].field_0x14;
LAB_0027a0ab:
          *(ushort *)&pCVar2[uVar9].field_0x14 = uVar8 & 0xfff3 | 8;
        }
        else if ((uVar8 & 8) == 0) goto LAB_0027a0ab;
        sVar7 = sVar7 + 1;
      } while (sVar1 != sVar7);
    }
  }
  if ((r0_.typ == VM_OBJ) && (r0_.val.obj != 0)) {
    pCVar2 = this->pages_[r0_.val.obj >> 0xc];
    uVar6 = r0_.val.obj & 0xfff;
    uVar8 = *(ushort *)&pCVar2[uVar6].field_0x14;
    if ((uVar8 & 0x20c) == 0x200) {
      pCVar2[uVar6].next_obj_ = this->gc_queue_head_;
      this->gc_queue_head_ = uVar3;
      uVar8 = *(ushort *)&pCVar2[uVar6].field_0x14;
    }
    else if ((uVar8 & 8) != 0) goto LAB_0027a12b;
    *(ushort *)&pCVar2[uVar6].field_0x14 = uVar8 & 0xfff3 | 8;
  }
LAB_0027a12b:
  pvVar5 = this->global_var_head_;
  do {
    if (pvVar5 == (vm_globalvar_t *)0x0) {
      return;
    }
    if (((pvVar5->val).typ == VM_OBJ) && (uVar6 = (pvVar5->val).val.obj, uVar6 != 0)) {
      pCVar2 = this->pages_[uVar6 >> 0xc];
      uVar9 = uVar6 & 0xfff;
      uVar8 = *(ushort *)&pCVar2[uVar9].field_0x14;
      if ((uVar8 & 0x20c) == 0x200) {
        pCVar2[uVar9].next_obj_ = this->gc_queue_head_;
        this->gc_queue_head_ = uVar6;
        uVar8 = *(ushort *)&pCVar2[uVar9].field_0x14;
      }
      else if ((uVar8 & 8) != 0) goto LAB_0027a194;
      *(ushort *)&pCVar2[uVar9].field_0x14 = uVar8 & 0xfff3 | 8;
    }
LAB_0027a194:
    pvVar5 = pvVar5->nxt;
  } while( true );
}

Assistant:

void CVmObjTable::gc_trace_globals(VMG0_)
{
    CVmObjGlobPage *pg;
    vm_val_t *val;
    vm_globalvar_t *var;

    /* trace each page of globals */
    for (pg = globals_ ; pg != 0 ; pg = pg->nxt_)
    {
        size_t i;
        vm_obj_id_t *objp;

        /* trace each item on this page */
        for (objp = pg->objs_, i = pg->used_ ; i != 0 ; ++objp, --i)
        {
            /* trace this global */
            add_to_gc_queue(*objp, VMOBJ_REACHABLE);
        }
    }

    /* the return value register (R0) is a machine global */
    val = G_interpreter->get_r0();
    if (val->typ == VM_OBJ && val->val.obj != VM_INVALID_OBJ)
        add_to_gc_queue(val->val.obj, VMOBJ_REACHABLE);

    /* trace the global variables defined by other subsystems */
    for (var = global_var_head_ ; var != 0 ; var = var->nxt)
    {
        /* if this global variable contains an object, trace it */
        if (var->val.typ == VM_OBJ && var->val.val.obj != VM_INVALID_OBJ)
            add_to_gc_queue(var->val.val.obj, VMOBJ_REACHABLE);
    }
}